

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::call_match
          (Dynamic_Object_Constructor *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *vals,
          Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  int iVar2;
  initializer_list<chaiscript::Boxed_Value> __l;
  allocator_type local_c1;
  Boxed_Value local_c0;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> new_vals;
  string local_98;
  Dynamic_Object local_78;
  
  std::__cxx11::string::string((string *)&local_98,(string *)&this->m_type_name);
  Dynamic_Object::Dynamic_Object(&local_78,&local_98);
  Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>(&local_c0,&local_78,false);
  __l._M_len = 1;
  __l._M_array = &local_c0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (&new_vals,__l,&local_c1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Dynamic_Object::~Dynamic_Object(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  insert<__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,void>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)&new_vals,
             (const_iterator)
             new_vals.
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (vals->
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (vals->
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  peVar1 = (this->m_func).
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  iVar2 = (*peVar1->_vptr_Proxy_Function_Base[3])(peVar1,&new_vals,t_conversions);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&new_vals)
  ;
  return SUB41(iVar2,0);
}

Assistant:

virtual bool call_match(const std::vector<Boxed_Value> &vals, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
          {
            std::vector<Boxed_Value> new_vals{Boxed_Value(Dynamic_Object(m_type_name))};
            new_vals.insert(new_vals.end(), vals.begin(), vals.end());

            return m_func->call_match(new_vals, t_conversions);
          }